

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O0

void test_compat_zip_3(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  la_int64_t lVar5;
  size_t local_30;
  size_t s;
  char *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  
  ae = (archive_entry *)anon_var_dwarf_142a0;
  extract_reference_file("test_compat_zip_3.zip");
  p = (char *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'k',(uint)((archive *)p != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'l',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",p);
  iVar1 = archive_read_support_format_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",p);
  wVar2 = archive_read_open_filename((archive_conflict *)p,(char *)ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'n',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",p);
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",p);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
             ,L'r',"soapui-4.0.0/","\"soapui-4.0.0/\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  lVar5 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L's',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_size_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L't',wVar2,"archive_entry_size_is_set(ae)",(void *)0x0);
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'u',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'x',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",p);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
             ,L'y',"soapui-4.0.0/soapui-settings.xml","\"soapui-4.0.0/soapui-settings.xml\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'z',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  lVar5 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'{',0x406,"1030",lVar5,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_size_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'|',wVar2,"archive_entry_size_is_set(ae)",(void *)0x0);
  archive_entry_set_pathname((archive_entry *)a,"test_3.txt");
  pcVar4 = archive_zlib_version();
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'\x8a');
    test_skipping("Skipping ZIP compression check, no libz support");
  }
  else {
    iVar1 = archive_read_extract((archive *)p,(archive_entry *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_extract(a, ae, 0)",p);
    s = (size_t)slurpfile(&local_30,"test_3.txt");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'\x86',local_30,"s",0x406,"1030",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'\x87',(void *)s,"p","<?xml versio","\"<?xml versio\"",0xc,"12",
                        (void *)0x0);
    free((void *)s);
  }
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x8c',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",p);
  iVar1 = archive_read_close((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x8e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",p);
  iVar1 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x8f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",p);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_3)
{
	const char *refname = "test_compat_zip_3.zip";
	struct archive_entry *ae;
	struct archive *a;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 10240));

	/* First entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("soapui-4.0.0/", archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));

	/* Second entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("soapui-4.0.0/soapui-settings.xml", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(1030, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));

	/* Extract under a different name. */
	archive_entry_set_pathname(ae, "test_3.txt");
	if(archive_zlib_version() != NULL) {
		char *p;
		size_t s;
		assertEqualIntA(a, ARCHIVE_OK, archive_read_extract(a, ae, 0));
		/* Verify the first 12 bytes actually got written to disk correctly. */
		p = slurpfile(&s, "test_3.txt");
		assertEqualInt(s, 1030);
		assertEqualMem(p, "<?xml versio", 12);
		free(p);
	} else {
		skipping("Skipping ZIP compression check, no libz support");
	}
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}